

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

shared_ptr<Instance> get_shared_instance(string *type,string *value)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  element_type *in_RDI;
  shared_ptr<Instance> sVar7;
  shared_ptr<Instance> *instance;
  shared_ptr<BooleanInstance> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff65;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  
  std::shared_ptr<Instance>::shared_ptr((shared_ptr<Instance> *)0x1b31b9);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff67,
                                   CONCAT16(in_stack_ffffffffffffff66,
                                            CONCAT15(in_stack_ffffffffffffff65,
                                                     CONCAT14(in_stack_ffffffffffffff64,
                                                              in_stack_ffffffffffffff60)))),
                          (char *)in_stack_ffffffffffffff58);
  if (bVar1) {
    std::make_shared<BooleanInstance,std::__cxx11::string_const&>(in_stack_ffffffffffffff88);
    std::shared_ptr<Instance>::operator=
              ((shared_ptr<Instance> *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,
                                 CONCAT15(in_stack_ffffffffffffff65,
                                          CONCAT14(in_stack_ffffffffffffff64,
                                                   in_stack_ffffffffffffff60)))),
               in_stack_ffffffffffffff58);
    std::shared_ptr<BooleanInstance>::~shared_ptr((shared_ptr<BooleanInstance> *)0x1b320a);
  }
  uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff67,
                                   CONCAT16(in_stack_ffffffffffffff66,
                                            CONCAT15(in_stack_ffffffffffffff65,
                                                     CONCAT14(in_stack_ffffffffffffff64,
                                                              in_stack_ffffffffffffff60)))),
                          (char *)in_stack_ffffffffffffff58);
  if ((bool)uVar2) {
    std::make_shared<CharacterInstance,std::__cxx11::string_const&>(in_stack_ffffffffffffff88);
    std::shared_ptr<Instance>::operator=
              ((shared_ptr<Instance> *)
               CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff66,
                                       CONCAT15(in_stack_ffffffffffffff65,
                                                CONCAT14(in_stack_ffffffffffffff64,
                                                         in_stack_ffffffffffffff60)))),
               (shared_ptr<CharacterInstance> *)in_stack_ffffffffffffff58);
    std::shared_ptr<CharacterInstance>::~shared_ptr((shared_ptr<CharacterInstance> *)0x1b327d);
  }
  uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff66,
                                                  CONCAT15(in_stack_ffffffffffffff65,
                                                           CONCAT14(in_stack_ffffffffffffff64,
                                                                    in_stack_ffffffffffffff60)))),
                          (char *)in_stack_ffffffffffffff58);
  if ((bool)uVar3) {
    std::make_shared<IntegerInstance,std::__cxx11::string_const&>(in_stack_ffffffffffffff88);
    std::shared_ptr<Instance>::operator=
              ((shared_ptr<Instance> *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_ffffffffffffff65,
                                                      CONCAT14(in_stack_ffffffffffffff64,
                                                               in_stack_ffffffffffffff60)))),
               (shared_ptr<IntegerInstance> *)in_stack_ffffffffffffff58);
    std::shared_ptr<IntegerInstance>::~shared_ptr((shared_ptr<IntegerInstance> *)0x1b32ce);
  }
  uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_ffffffffffffff65,
                                                                 CONCAT14(in_stack_ffffffffffffff64,
                                                                          in_stack_ffffffffffffff60)
                                                                ))),
                          (char *)in_stack_ffffffffffffff58);
  if ((bool)uVar4) {
    std::make_shared<FloatInstance,std::__cxx11::string_const&>(in_stack_ffffffffffffff88);
    std::shared_ptr<Instance>::operator=
              ((shared_ptr<Instance> *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(in_stack_ffffffffffffff64,
                                                                     in_stack_ffffffffffffff60)))),
               (shared_ptr<FloatInstance> *)in_stack_ffffffffffffff58);
    std::shared_ptr<FloatInstance>::~shared_ptr((shared_ptr<FloatInstance> *)0x1b331f);
  }
  uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60)))),
                          (char *)in_stack_ffffffffffffff58);
  _Var6._M_pi = extraout_RDX;
  if ((bool)uVar5) {
    std::make_shared<StringInstance,std::__cxx11::string_const&>(in_stack_ffffffffffffff88);
    std::shared_ptr<Instance>::operator=
              ((shared_ptr<Instance> *)
               CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,in_stack_ffffffffffffff60
                                                                    )))),
               (shared_ptr<StringInstance> *)in_stack_ffffffffffffff58);
    std::shared_ptr<StringInstance>::~shared_ptr((shared_ptr<StringInstance> *)0x1b3370);
    _Var6._M_pi = extraout_RDX_00;
  }
  sVar7.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar7.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Instance>)sVar7.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Instance> get_shared_instance(const std::string& type, const std::string& value) {
    std::shared_ptr<Instance> instance;
    if (type == "Boolean")
        instance = std::make_shared<BooleanInstance>(value);
    if (type == "Character")
        instance = std::make_shared<CharacterInstance>(value);
    if (type == "Integer")
        instance = std::make_shared<IntegerInstance>(value);
    if (type == "Float")
        instance = std::make_shared<FloatInstance>(value);
    if (type == "String")
        instance = std::make_shared<StringInstance>(value);
    return instance;
}